

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

string_t * __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::print
          (string_t *__return_storage_ptr__,tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          int indent)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QChar QVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  string_t spaces;
  QString value;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  string_t tmp;
  
  (__return_storage_ptr__->m_str).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_str).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->m_str).d.size = 0;
  bVar2 = tag_t<cfgfile::qstring_trait_t>::is_defined(&this->super_tag_t<cfgfile::qstring_trait_t>);
  if (bVar2) {
    qstring_wrapper_t::qstring_wrapper_t
              ((qstring_wrapper_t *)&value,indent,const_t<cfgfile::qstring_trait_t>::c_tab);
    QString::append((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&value.d);
    QVar4.ucs = (char16_t)__return_storage_ptr__;
    QString::append(QVar4);
    QString::append((QString *)__return_storage_ptr__);
    QString::append(QVar4);
    spaces.m_str.d.d = (this->m_value).d.d;
    spaces.m_str.d.ptr = (this->m_value).d.ptr;
    spaces.m_str.d.size = (this->m_value).d.size;
    if (spaces.m_str.d.d == (Data *)0x0) {
      value.d.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((spaces.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((spaces.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      value.d.d = spaces.m_str.d.d;
    }
    if (value.d.d != (Data *)0x0) {
      LOCK();
      ((value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    value.d.ptr = spaces.m_str.d.ptr;
    value.d.size = spaces.m_str.d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&spaces);
    lVar6 = (ulong)(0 < value.d.size % 0x50) + value.d.size / 0x50;
    if (lVar6 == 0) {
      QString::append(QVar4);
      QString::append(QVar4);
    }
    else {
      qstring_wrapper_t::qstring_wrapper_t
                (&spaces,(int)(this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.size + 2,
                 const_t<cfgfile::qstring_trait_t>::c_space);
      if (lVar6 < 1) {
        lVar6 = 0;
      }
      for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
        if (lVar5 != 0) {
          QString::append(QVar4);
          qstring_wrapper_t::qstring_wrapper_t
                    ((qstring_wrapper_t *)&tmp,indent,const_t<cfgfile::qstring_trait_t>::c_tab);
          QString::append((QString *)__return_storage_ptr__);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp);
          QString::append((QString *)__return_storage_ptr__);
        }
        QString::mid((longlong)&local_78,(longlong)&value);
        local_60.d = local_78.d;
        local_60.ptr = local_78.ptr;
        local_60.size = local_78.size;
        if (local_78.d != (Data *)0x0) {
          LOCK();
          ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        to_cfgfile_format<cfgfile::qstring_trait_t>(&tmp,(string_t *)&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QString::append((QString *)__return_storage_ptr__);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&spaces);
    }
    iVar3 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar3) != ((long *)CONCAT44(extraout_var,iVar3))[1]) {
      QString::append(QVar4);
      iVar3 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
      puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1];
      for (puVar7 = *(undefined8 **)CONCAT44(extraout_var_00,iVar3); puVar7 != puVar1;
          puVar7 = puVar7 + 1) {
        (**(code **)(*(long *)*puVar7 + 0x18))(&spaces,(long *)*puVar7,indent + 1);
        QString::append((QString *)__return_storage_ptr__);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&spaces);
      }
      qstring_wrapper_t::qstring_wrapper_t(&spaces,indent,const_t<cfgfile::qstring_trait_t>::c_tab);
      QString::append((QString *)__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&spaces);
    }
    QString::append(QVar4);
    QString::append(QVar4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&value.d);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );
			result.push_back( const_t< Trait >::c_space );

			QString value = format_t< QString, Trait >::to_string( m_value );

			const typename Trait::pos_t sections =
				( value.length() / c_max_string_length +
				( value.length() % c_max_string_length > 0 ? 1 : 0 ) );

			if( sections )
			{
				const typename Trait::string_t spaces = typename Trait::string_t(
					this->name().length() + 2, const_t< Trait >::c_space );

				for( typename Trait::pos_t i = 0; i < sections; ++i )
				{
					if( i > 0 )
					{
						result.push_back( const_t< Trait >::c_carriage_return );

						result.append( typename Trait::string_t( indent,
							const_t< Trait >::c_tab ) );

						result.append( spaces );
					}

					const typename Trait::string_t tmp =
						to_cfgfile_format< Trait >(
							value.mid( i * c_max_string_length,
								c_max_string_length ) );

					result.append( tmp );
				}
			}
			else
			{
				result.push_back( const_t< Trait >::c_quotes );
				result.push_back( const_t< Trait >::c_quotes );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}